

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O1

sexp_conflict
sexp_blocker(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict portorfd,
            sexp_conflict timeout)

{
  char *pcVar1;
  sexp psVar2;
  sexp_tag_t sVar3;
  sexp_conflict psVar4;
  sexp_conflict *ppsVar5;
  sexp_conflict __dest;
  sexp_conflict psVar6;
  ushort uVar7;
  
  if (((ulong)portorfd & 3) == 0) {
    if (portorfd->tag - 0x10 < 2) {
      psVar2 = (portorfd->value).type.getters;
      if (psVar2 == (sexp)0x0) {
        psVar2 = (portorfd->value).type.slots;
        sVar3 = 0xffffffff;
        if ((((ulong)psVar2 & 3) == 0) && (psVar2->tag == 0x12)) {
          sVar3 = (psVar2->value).promise.donep;
        }
      }
      else {
        sVar3 = fileno((FILE *)psVar2);
      }
      goto LAB_00102cb8;
    }
    if (portorfd->tag == 0x12) {
      sVar3 = (portorfd->value).promise.donep;
      goto LAB_00102cb8;
    }
  }
  if (((ulong)portorfd & 1) == 0) {
    psVar4 = (sexp_conflict)sexp_type_exception(ctx,self,0x10,portorfd);
    return psVar4;
  }
  sVar3 = (sexp_tag_t)((ulong)portorfd >> 1);
LAB_00102cb8:
  if (-1 < (int)sVar3) {
    uVar7 = 1;
    if (((ulong)portorfd & 3) == 0) {
      uVar7 = (ushort)(portorfd->tag == 0x11) * 3 + 1;
    }
    psVar2 = (ctx->value).type.setters;
    ppsVar5 = (psVar2->value).context.mark_stack[0xb].end;
    if ((((ulong)ppsVar5 & 3) != 0 || ppsVar5 == (sexp_conflict *)0x0) ||
       ((long)(psVar2->value).context.mark_stack[0xc].prev >> 1 != (ulong)*(uint *)ppsVar5)) {
      ppsVar5 = (sexp_conflict *)
                sexp_alloc_tagged_aux
                          (ctx,0x20,(long)(psVar2->value).context.mark_stack[0xc].prev >> 1);
      psVar4 = (sexp_conflict)malloc(0x80);
      ppsVar5[1] = psVar4;
      ppsVar5[2] = (sexp_conflict)0x0;
      ppsVar5[3] = (sexp_conflict)0x10;
      (((ctx->value).type.setters)->value).context.mark_stack[0xb].end = ppsVar5;
    }
    psVar4 = ppsVar5[2];
    if (psVar4 == (sexp_conflict)0x0) {
      psVar6 = (sexp_conflict)0x0;
    }
    else {
      psVar6 = (sexp_conflict)0x0;
      do {
        if ((&ppsVar5[1]->tag)[(long)psVar6 * 2] == sVar3) {
          pcVar1 = &ppsVar5[1]->markedp + (long)psVar6 * 8;
          *(ushort *)pcVar1 = *(ushort *)pcVar1 | uVar7;
          goto LAB_00102ddc;
        }
        psVar6 = (sexp_conflict)((long)&psVar6->tag + 1);
      } while (psVar4 != psVar6);
      psVar6 = (sexp_conflict)(ulong)(uint)((int)psVar4 * 2);
    }
    if (psVar4 == ppsVar5[3]) {
      ppsVar5[3] = psVar6;
      psVar4 = ppsVar5[1];
      __dest = (sexp_conflict)malloc((long)psVar6 << 3);
      ppsVar5[1] = __dest;
      if (__dest != (sexp_conflict)0x0) {
        memcpy(__dest,psVar4,(long)psVar6 << 3);
      }
      free(psVar4);
    }
    psVar4 = ppsVar5[1];
    psVar6 = ppsVar5[2];
    ppsVar5[2] = (sexp_conflict)((long)&psVar6->tag + 1);
    (&psVar4->tag)[(long)psVar6 * 2] = sVar3;
    *(ushort *)(&psVar4->markedp + (long)psVar6 * 8) = uVar7;
  }
LAB_00102ddc:
  (ctx->value).flonum_bits[0x60a3] = '\x01';
  (ctx->value).opcode.dl = portorfd;
  sexp_insert_timed(ctx,ctx,timeout);
  return (sexp_conflict)0x43e;
}

Assistant:

sexp sexp_blocker (sexp ctx, sexp self, sexp_sint_t n, sexp portorfd, sexp timeout) {
  int fd;
  /* register the fd */
  if (sexp_portp(portorfd))
    fd = sexp_port_fileno(portorfd);
  else if (sexp_filenop(portorfd))
    fd = sexp_fileno_fd(portorfd);
  else if (sexp_fixnump(portorfd))
    fd = sexp_unbox_fixnum(portorfd);
  else
    return sexp_type_exception(ctx, self, SEXP_IPORT, portorfd);
  if (fd >= 0)
    sexp_insert_pollfd(ctx, fd, sexp_oportp(portorfd) ? POLLOUT : POLLIN);
  /* pause the current thread */
  sexp_context_waitp(ctx) = 1;
  sexp_context_event(ctx) = portorfd;
  sexp_insert_timed(ctx, ctx, timeout);
  return SEXP_VOID;
}